

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void freeexps(FuncState *fs,expdesc *e1,expdesc *e2)

{
  int iVar1;
  int reg;
  int reg_00;
  
  reg = -1;
  iVar1 = reg;
  if (e1->k == VNONRELOC) {
    iVar1 = (e1->u).info;
  }
  if (e2->k == VNONRELOC) {
    reg = (e2->u).info;
  }
  reg_00 = reg;
  if (reg < iVar1) {
    reg_00 = iVar1;
  }
  if (iVar1 < reg) {
    reg = iVar1;
  }
  freereg(fs,reg_00);
  freereg(fs,reg);
  return;
}

Assistant:

static void freeexps(FuncState *fs, expdesc *e1, expdesc *e2) {
    int r1 = (e1->k == VNONRELOC) ? e1->u.info : -1;
    int r2 = (e2->k == VNONRELOC) ? e2->u.info : -1;
    if (r1 > r2) {
        freereg(fs, r1);
        freereg(fs, r2);
    } else {
        freereg(fs, r2);
        freereg(fs, r1);
    }
}